

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadratictetra.cpp
# Opt level: O3

void pzgeom::TPZQuadraticTetra::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *par,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  uint uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  Fad<double> *pFVar9;
  Fad<double> *pFVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  long lVar33;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  Fad<double> qsi;
  Fad<double> eta;
  Fad<double> zeta;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> local_178;
  Fad<double> local_158;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> local_138;
  Fad<double> local_118;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  local_f8;
  Fad<double> local_e8;
  undefined1 local_c8 [24];
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> local_b0;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *local_90;
  Fad<double> *local_88;
  double dStack_80;
  Fad<double> *local_78;
  undefined1 *local_70;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> **local_68;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  local_60;
  Fad<double> *local_50;
  Fad<double> *local_48;
  Fad<double> **local_40;
  Fad<double> *local_38;
  
  pFVar9 = par->fStore;
  local_158.val_ = pFVar9->val_;
  uVar1 = (pFVar9->dx_).num_elts;
  local_158.dx_.ptr_to_data = (double *)0x0;
  pFVar10 = pFVar9;
  local_158.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar8 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar8 = (long)(int)uVar1 << 3;
    }
    local_158.dx_.ptr_to_data = (double *)operator_new__(uVar8);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_158.dx_.ptr_to_data,
               (EVP_PKEY_CTX *)(pFVar9->dx_).ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar1);
    pFVar10 = par->fStore;
  }
  local_158.defaultVal = pFVar9->defaultVal;
  local_118.val_ = pFVar10[1].val_;
  uVar1 = pFVar10[1].dx_.num_elts;
  local_118.dx_.ptr_to_data = (double *)0x0;
  pFVar9 = pFVar10;
  local_118.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar8 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar8 = (long)(int)uVar1 * 8;
    }
    local_118.dx_.ptr_to_data = (double *)operator_new__(uVar8);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_118.dx_.ptr_to_data,
               (EVP_PKEY_CTX *)pFVar10[1].dx_.ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar1);
    pFVar9 = par->fStore;
  }
  local_118.defaultVal = pFVar10[1].defaultVal;
  local_e8.val_ = pFVar9[2].val_;
  uVar1 = pFVar9[2].dx_.num_elts;
  local_e8.dx_.ptr_to_data = (double *)0x0;
  local_e8.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar8 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar8 = (long)(int)uVar1 * 8;
    }
    local_e8.dx_.ptr_to_data = (double *)operator_new__(uVar8);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_e8.dx_.ptr_to_data,(EVP_PKEY_CTX *)pFVar9[2].dx_.ptr_to_data
               ,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_e8.defaultVal = pFVar9[2].defaultVal;
  local_178.fadexpr_.right_ = &local_e8;
  local_40 = &local_50;
  local_138.fadexpr_.right_ = &local_118;
  local_90 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&local_40;
  local_b0.fadexpr_.right_ = &local_158;
  local_88 = (Fad<double> *)0x3ff0000000000000;
  dStack_80 = 0.0;
  local_178.fadexpr_.left_.constant_ = 2.0;
  local_178.fadexpr_.left_.defaultVal = 0.0;
  local_138.fadexpr_.left_.constant_ = 2.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_60.fadexpr_.left_ =
       (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
        *)&local_70;
  local_60.fadexpr_.right_ =
       (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)(local_c8 + 0x18);
  local_b0.fadexpr_.left_.constant_ = 2.0;
  local_b0.fadexpr_.left_.defaultVal = 0.0;
  local_c8._0_8_ = &local_60;
  local_c8._8_8_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)0x3ff0000000000000;
  local_c8._16_8_ = (double *)0x0;
  local_f8.fadexpr_.left_ =
       (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
        *)&local_90;
  local_f8.fadexpr_.right_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_c8;
  local_68 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> **)&local_138;
  local_50 = local_178.fadexpr_.right_;
  local_48 = local_138.fadexpr_.right_;
  local_38 = local_b0.fadexpr_.right_;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_70 = (undefined1 *)&local_178;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_70 = (undefined1 *)&local_178;
  Fad<double>::operator=
            (phi->fElem,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>_>
              *)&local_f8);
  local_178.fadexpr_.left_.constant_ = 2.0;
  local_178.fadexpr_.left_.defaultVal = 0.0;
  local_178.fadexpr_.right_ = &local_158;
  local_138.fadexpr_.left_.constant_ = 1.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_b0._0_8_ = local_178.fadexpr_.right_;
  local_b0.fadexpr_.left_.constant_ = (double)&local_138;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_138._0_8_ = &local_178;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_138._0_8_ = &local_178;
  Fad<double>::operator=
            (phi->fElem + 1,
             (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)(local_c8 + 0x18));
  local_178.fadexpr_.left_.constant_ = 2.0;
  local_178.fadexpr_.left_.defaultVal = 0.0;
  local_178.fadexpr_.right_ = &local_118;
  local_138.fadexpr_.left_.constant_ = 1.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_b0._0_8_ = local_178.fadexpr_.right_;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_138._0_8_ = &local_178;
    local_b0.fadexpr_.left_.constant_ = (double)&local_138;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_138._0_8_ = &local_178;
  local_b0.fadexpr_.left_.constant_ = (double)&local_138;
  Fad<double>::operator=
            (phi->fElem + 2,
             (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)(local_c8 + 0x18));
  local_178.fadexpr_.left_.constant_ = 2.0;
  local_178.fadexpr_.left_.defaultVal = 0.0;
  local_178.fadexpr_.right_ = &local_e8;
  local_138.fadexpr_.left_.constant_ = 1.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_b0._0_8_ = local_178.fadexpr_.right_;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 4) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_138._0_8_ = &local_178;
    local_b0.fadexpr_.left_.constant_ = (double)&local_138;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_138._0_8_ = &local_178;
  local_b0.fadexpr_.left_.constant_ = (double)&local_138;
  Fad<double>::operator=
            (phi->fElem + 3,
             (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)(local_c8 + 0x18));
  local_178.fadexpr_.left_.constant_ = -4.0;
  local_178.fadexpr_.left_.defaultVal = 0.0;
  local_178.fadexpr_.right_ = &local_158;
  local_c8._8_8_ = &local_118;
  local_88 = &local_e8;
  local_138.fadexpr_.left_.constant_ = 1.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_138._0_8_ = (Fad<double> *)&local_90;
  local_c8._0_8_ = local_178.fadexpr_.right_;
  local_90 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_c8;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 5) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_b0._0_8_ = (Fad<double> *)&local_178;
    local_b0.fadexpr_.left_.constant_ = (double)&local_138;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_b0._0_8_ = (Fad<double> *)&local_178;
  local_b0.fadexpr_.left_.constant_ = (double)&local_138;
  Fad<double>::operator=
            (phi->fElem + 4,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)(local_c8 + 0x18));
  local_178.fadexpr_.left_.constant_ = 4.0;
  local_178.fadexpr_.left_.defaultVal = 0.0;
  local_178.fadexpr_.right_ = &local_158;
  local_138.fadexpr_.left_.constant_ = (double)&local_118;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 6) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_138._0_8_ = &local_178;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_138._0_8_ = &local_178;
  Fad<double>::operator=
            (phi->fElem + 5,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)&local_138);
  local_178.fadexpr_.left_.constant_ = -4.0;
  local_178.fadexpr_.left_.defaultVal = 0.0;
  local_178.fadexpr_.right_ = &local_118;
  local_c8._0_8_ = &local_158;
  local_88 = &local_e8;
  local_138.fadexpr_.left_.constant_ = 1.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_c8._8_8_ = local_178.fadexpr_.right_;
  local_b0.fadexpr_.left_.constant_ = (double)&local_138;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 7) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_138._0_8_ = (Fad<double> *)&local_90;
    local_b0._0_8_ = (Fad<double> *)&local_178;
    local_90 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_c8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_138._0_8_ = (Fad<double> *)&local_90;
  local_b0._0_8_ = (Fad<double> *)&local_178;
  local_90 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_c8;
  Fad<double>::operator=
            (phi->fElem + 6,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)(local_c8 + 0x18));
  local_178.fadexpr_.left_.constant_ = -4.0;
  local_178.fadexpr_.left_.defaultVal = 0.0;
  local_c8._0_8_ = &local_158;
  local_c8._8_8_ = &local_118;
  local_138.fadexpr_.left_.constant_ = 1.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_178.fadexpr_.right_ = &local_e8;
  local_88 = &local_e8;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 8) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_138._0_8_ = (Fad<double> *)&local_90;
    local_b0._0_8_ = (Fad<double> *)&local_178;
    local_b0.fadexpr_.left_.constant_ = (double)&local_138;
    local_90 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_c8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar9 = (Fad<double> *)(local_c8 + 0x18);
  local_138._0_8_ = (Fad<double> *)&local_90;
  local_b0._0_8_ = (Fad<double> *)&local_178;
  local_b0.fadexpr_.left_.constant_ = (double)&local_138;
  local_90 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_c8;
  Fad<double>::operator=
            (phi->fElem + 7,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)pFVar9);
  local_178.fadexpr_.left_.constant_ = 4.0;
  local_178.fadexpr_.left_.defaultVal = 0.0;
  local_178.fadexpr_.right_ = &local_158;
  local_138.fadexpr_.left_.constant_ = (double)&local_e8;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 9) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_138._0_8_ = &local_178;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_138._0_8_ = &local_178;
  Fad<double>::operator=
            (phi->fElem + 8,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)&local_138);
  local_178.fadexpr_.left_.constant_ = 4.0;
  local_178.fadexpr_.left_.defaultVal = 0.0;
  local_178.fadexpr_.right_ = &local_118;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 10) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_138._0_8_ = &local_178;
    local_138.fadexpr_.left_.constant_ = (double)&local_e8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_138._0_8_ = &local_178;
  local_138.fadexpr_.left_.constant_ = (double)&local_e8;
  Fad<double>::operator=
            (phi->fElem + 9,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)&local_138);
  local_138.fadexpr_.left_.constant_ = 4.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_138.fadexpr_.right_ = &local_158;
  local_178.fadexpr_.left_.constant_ = -3.0;
  local_178.fadexpr_.left_.defaultVal = 0.0;
  local_b0.fadexpr_.left_.constant_ = 4.0;
  local_b0.fadexpr_.left_.defaultVal = 0.0;
  local_b0.fadexpr_.right_ = &local_118;
  local_88 = (Fad<double> *)0x4010000000000000;
  dStack_80 = 0.0;
  local_c8._0_8_ = &local_f8;
  local_178.fadexpr_.right_ = (Fad<double> *)&local_138;
  local_f8.fadexpr_.right_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)pFVar9;
  local_c8._8_8_ = (Fad<double> *)&local_90;
  local_78 = &local_e8;
  if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_f8.fadexpr_.left_ =
         (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
          *)&local_178;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_f8.fadexpr_.left_ =
       (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
        *)&local_178;
  Fad<double>::operator=
            (dphi->fElem,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)local_c8);
  local_138.fadexpr_.left_.constant_ = 4.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_138.fadexpr_.right_ = &local_158;
  local_178.fadexpr_.left_.constant_ = -3.0;
  local_178.fadexpr_.left_.defaultVal = 0.0;
  local_b0.fadexpr_.left_.constant_ = 4.0;
  local_b0.fadexpr_.left_.defaultVal = 0.0;
  local_b0.fadexpr_.right_ = &local_118;
  local_88 = (Fad<double> *)0x4010000000000000;
  dStack_80 = 0.0;
  local_c8._0_8_ = &local_f8;
  if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_178.fadexpr_.right_ = (Fad<double> *)&local_138;
    local_f8.fadexpr_.left_ =
         (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
          *)&local_178;
    local_f8.fadexpr_.right_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)pFVar9;
    local_c8._8_8_ = (Fad<double> *)&local_90;
    local_78 = &local_e8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_178.fadexpr_.right_ = (Fad<double> *)&local_138;
  local_f8.fadexpr_.left_ =
       (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
        *)&local_178;
  local_f8.fadexpr_.right_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)pFVar9;
  local_c8._8_8_ = (Fad<double> *)&local_90;
  local_78 = &local_e8;
  Fad<double>::operator=
            (dphi->fElem + 1,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)local_c8);
  local_138.fadexpr_.left_.constant_ = 4.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_138.fadexpr_.right_ = &local_158;
  local_178.fadexpr_.left_.constant_ = -3.0;
  local_178.fadexpr_.left_.defaultVal = 0.0;
  local_b0.fadexpr_.left_.constant_ = 4.0;
  local_b0.fadexpr_.left_.defaultVal = 0.0;
  local_b0.fadexpr_.right_ = &local_118;
  local_88 = (Fad<double> *)0x4010000000000000;
  dStack_80 = 0.0;
  local_c8._0_8_ = &local_f8;
  if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
     ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_178.fadexpr_.right_ = (Fad<double> *)&local_138;
    local_f8.fadexpr_.left_ =
         (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
          *)&local_178;
    local_f8.fadexpr_.right_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)pFVar9;
    local_c8._8_8_ = (Fad<double> *)&local_90;
    local_78 = &local_e8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_178.fadexpr_.right_ = (Fad<double> *)&local_138;
  local_f8.fadexpr_.left_ =
       (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
        *)&local_178;
  local_f8.fadexpr_.right_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)pFVar9;
  local_c8._8_8_ = (Fad<double> *)&local_90;
  local_78 = &local_e8;
  Fad<double>::operator=
            (dphi->fElem + 2,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)local_c8);
  local_138.fadexpr_.left_.constant_ = 4.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_138.fadexpr_.right_ = &local_158;
  local_178.fadexpr_.left_.constant_ = -1.0;
  local_178.fadexpr_.left_.defaultVal = 0.0;
  lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
    local_178.fadexpr_.right_ = (Fad<double> *)&local_138;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_178.fadexpr_.right_ = (Fad<double> *)&local_138;
  Fad<double>::operator=
            (dphi->fElem + lVar4,
             (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)&local_178);
  lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar10 = dphi->fElem;
  pFVar10[lVar4 + 1].val_ = 0.0;
  if (pFVar10[lVar4 + 1].dx_.num_elts != 0) {
    local_178._0_8_ = 0;
    Vector<double>::operator=(&pFVar10[lVar4 + 1].dx_,(double *)&local_178);
    lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  }
  if ((lVar4 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar10 = dphi->fElem;
  pFVar10[lVar4 + 2].val_ = 0.0;
  if (pFVar10[lVar4 + 2].dx_.num_elts != 0) {
    local_178._0_8_ = 0;
    Vector<double>::operator=(&pFVar10[lVar4 + 2].dx_,(double *)&local_178);
    lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  }
  if ((lVar4 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar10 = dphi->fElem;
  pFVar10[lVar4 * 2].val_ = 0.0;
  if (pFVar10[lVar4 * 2].dx_.num_elts != 0) {
    local_178._0_8_ = 0;
    Vector<double>::operator=(&pFVar10[lVar4 * 2].dx_,(double *)&local_178);
    lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  }
  local_138.fadexpr_.left_.constant_ = 4.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_138.fadexpr_.right_ = &local_118;
  local_178.fadexpr_.left_.constant_ = -1.0;
  local_178.fadexpr_.left_.defaultVal = 0.0;
  if ((lVar4 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
    local_178.fadexpr_.right_ = (Fad<double> *)&local_138;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_178.fadexpr_.right_ = (Fad<double> *)&local_138;
  Fad<double>::operator=
            (dphi->fElem + lVar4 * 2 + 1,
             (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)&local_178);
  lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar10 = dphi->fElem;
  pFVar10[lVar4 * 2 + 2].val_ = 0.0;
  if (pFVar10[lVar4 * 2 + 2].dx_.num_elts != 0) {
    local_178._0_8_ = 0;
    Vector<double>::operator=(&pFVar10[lVar4 * 2 + 2].dx_,(double *)&local_178);
    lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  }
  if ((lVar4 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar10 = dphi->fElem;
  pFVar10[lVar4 * 3].val_ = 0.0;
  if (pFVar10[lVar4 * 3].dx_.num_elts != 0) {
    local_178._0_8_ = 0;
    Vector<double>::operator=(&pFVar10[lVar4 * 3].dx_,(double *)&local_178);
    lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  }
  if ((lVar4 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar10 = dphi->fElem;
  pFVar10[lVar4 * 3 + 1].val_ = 0.0;
  if (pFVar10[lVar4 * 3 + 1].dx_.num_elts != 0) {
    local_178._0_8_ = 0;
    Vector<double>::operator=(&pFVar10[lVar4 * 3 + 1].dx_,(double *)&local_178);
    lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  }
  local_138.fadexpr_.left_.constant_ = 4.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_178.fadexpr_.left_.constant_ = -1.0;
  local_178.fadexpr_.left_.defaultVal = 0.0;
  local_138.fadexpr_.right_ = &local_e8;
  if ((lVar4 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
    local_178.fadexpr_.right_ = (Fad<double> *)&local_138;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_178.fadexpr_.right_ = (Fad<double> *)&local_138;
  Fad<double>::operator=
            (dphi->fElem + lVar4 * 3 + 2,
             (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)&local_178);
  local_138.fadexpr_.left_.constant_ = 2.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_138.fadexpr_.right_ = &local_158;
  local_c8._8_8_ = &local_118;
  local_b0.fadexpr_.left_.constant_ = 1.0;
  local_b0.fadexpr_.left_.defaultVal = 0.0;
  local_178.fadexpr_.left_.constant_ = -4.0;
  local_178.fadexpr_.left_.defaultVal = 0.0;
  lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  local_178.fadexpr_.right_ = pFVar9;
  local_c8._0_8_ = (Fad<double> *)&local_138;
  local_b0._0_8_ = (Fad<double> *)&local_90;
  local_90 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_c8;
  if ((lVar4 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
    local_88 = &local_e8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_88 = &local_e8;
  Fad<double>::operator=
            (dphi->fElem + lVar4 * 4,
             (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)&local_178);
  iVar3 = local_158.dx_.num_elts;
  lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar10 = dphi->fElem;
  uVar8 = (ulong)(uint)local_158.dx_.num_elts;
  uVar1 = pFVar10[lVar4 * 4 + 1].dx_.num_elts;
  if (local_158.dx_.num_elts == uVar1) {
    if (local_158.dx_.num_elts != 0) {
      pdVar5 = pFVar10[lVar4 * 4 + 1].dx_.ptr_to_data;
LAB_00fb9292:
      if (0 < iVar3) {
        uVar6 = 0;
        do {
          pdVar5[uVar6] = *(double *)((long)local_158.dx_.ptr_to_data + uVar6 * 8) * -4.0;
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
      }
    }
  }
  else if (local_158.dx_.num_elts == 0) {
    if (uVar1 != 0) {
      pdVar5 = pFVar10[lVar4 * 4 + 1].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar10[lVar4 * 4 + 1].dx_.num_elts = 0;
      pFVar10[lVar4 * 4 + 1].dx_.ptr_to_data = (double *)0x0;
    }
  }
  else {
    if (uVar1 != 0) {
      pdVar5 = pFVar10[lVar4 * 4 + 1].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar10[lVar4 * 4 + 1].dx_.ptr_to_data = (double *)0x0;
    }
    pFVar10[lVar4 * 4 + 1].dx_.num_elts = iVar3;
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar6 = uVar8 * 8;
    }
    pdVar5 = (double *)operator_new__(uVar6);
    pFVar10[lVar4 * 4 + 1].dx_.ptr_to_data = pdVar5;
    auVar2 = _DAT_014d28c0;
    if (local_158.dx_.num_elts != 0) goto LAB_00fb9292;
    if (0 < iVar3) {
      lVar7 = uVar8 - 1;
      auVar11._8_4_ = (int)lVar7;
      auVar11._0_8_ = lVar7;
      auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar11 = auVar11 ^ _DAT_014d28c0;
      auVar35 = _DAT_014d28b0;
      do {
        auVar34 = auVar35 ^ auVar2;
        if ((bool)(~(auVar34._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar34._0_4_ ||
                    auVar11._4_4_ < auVar34._4_4_) & 1)) {
          *(double *)((long)pdVar5 + lVar7) = local_158.defaultVal * -4.0;
        }
        if ((auVar34._12_4_ != auVar11._12_4_ || auVar34._8_4_ <= auVar11._8_4_) &&
            auVar34._12_4_ <= auVar11._12_4_) {
          *(double *)((long)pdVar5 + lVar7 + 8) = local_158.defaultVal * -4.0;
        }
        lVar33 = auVar35._8_8_;
        auVar35._0_8_ = auVar35._0_8_ + 2;
        auVar35._8_8_ = lVar33 + 2;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(iVar3 + 1U >> 1) << 4 != lVar7);
    }
  }
  iVar3 = local_158.dx_.num_elts;
  pFVar10[lVar4 * 4 + 1].val_ = local_158.val_ * -4.0;
  lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar10 = dphi->fElem;
  uVar8 = (ulong)(uint)local_158.dx_.num_elts;
  uVar1 = pFVar10[lVar4 * 4 + 2].dx_.num_elts;
  if (local_158.dx_.num_elts == uVar1) {
    if (local_158.dx_.num_elts != 0) {
      pdVar5 = pFVar10[lVar4 * 4 + 2].dx_.ptr_to_data;
LAB_00fb945a:
      if (0 < iVar3) {
        uVar6 = 0;
        do {
          pdVar5[uVar6] = *(double *)((long)local_158.dx_.ptr_to_data + uVar6 * 8) * -4.0;
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
      }
    }
  }
  else if (local_158.dx_.num_elts == 0) {
    if (uVar1 != 0) {
      pdVar5 = pFVar10[lVar4 * 4 + 2].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar10[lVar4 * 4 + 2].dx_.num_elts = 0;
      pFVar10[lVar4 * 4 + 2].dx_.ptr_to_data = (double *)0x0;
    }
  }
  else {
    if (uVar1 != 0) {
      pdVar5 = pFVar10[lVar4 * 4 + 2].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar10[lVar4 * 4 + 2].dx_.ptr_to_data = (double *)0x0;
    }
    pFVar10[lVar4 * 4 + 2].dx_.num_elts = iVar3;
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar6 = uVar8 * 8;
    }
    pdVar5 = (double *)operator_new__(uVar6);
    pFVar10[lVar4 * 4 + 2].dx_.ptr_to_data = pdVar5;
    auVar2 = _DAT_014d28c0;
    if (local_158.dx_.num_elts != 0) goto LAB_00fb945a;
    if (0 < iVar3) {
      lVar7 = uVar8 - 1;
      auVar12._8_4_ = (int)lVar7;
      auVar12._0_8_ = lVar7;
      auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar12 = auVar12 ^ _DAT_014d28c0;
      auVar34 = _DAT_014d28b0;
      do {
        auVar35 = auVar34 ^ auVar2;
        if ((bool)(~(auVar35._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar35._0_4_ ||
                    auVar12._4_4_ < auVar35._4_4_) & 1)) {
          *(double *)((long)pdVar5 + lVar7) = local_158.defaultVal * -4.0;
        }
        if ((auVar35._12_4_ != auVar12._12_4_ || auVar35._8_4_ <= auVar12._8_4_) &&
            auVar35._12_4_ <= auVar12._12_4_) {
          *(double *)((long)pdVar5 + lVar7 + 8) = local_158.defaultVal * -4.0;
        }
        lVar33 = auVar34._8_8_;
        auVar34._0_8_ = auVar34._0_8_ + 2;
        auVar34._8_8_ = lVar33 + 2;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(iVar3 + 1U >> 1) << 4 != lVar7);
    }
  }
  iVar3 = local_118.dx_.num_elts;
  pFVar10[lVar4 * 4 + 2].val_ = local_158.val_ * -4.0;
  lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 6)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar10 = dphi->fElem;
  uVar8 = (ulong)(uint)local_118.dx_.num_elts;
  uVar1 = pFVar10[lVar4 * 5].dx_.num_elts;
  if (local_118.dx_.num_elts == uVar1) {
    if (local_118.dx_.num_elts != 0) {
      pdVar5 = pFVar10[lVar4 * 5].dx_.ptr_to_data;
LAB_00fb9625:
      if (0 < iVar3) {
        uVar6 = 0;
        do {
          pdVar5[uVar6] = *(double *)((long)local_118.dx_.ptr_to_data + uVar6 * 8) * 4.0;
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
      }
    }
  }
  else if (local_118.dx_.num_elts == 0) {
    if (uVar1 != 0) {
      pdVar5 = pFVar10[lVar4 * 5].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar10[lVar4 * 5].dx_.num_elts = 0;
      pFVar10[lVar4 * 5].dx_.ptr_to_data = (double *)0x0;
    }
  }
  else {
    if (uVar1 != 0) {
      pdVar5 = pFVar10[lVar4 * 5].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar10[lVar4 * 5].dx_.ptr_to_data = (double *)0x0;
    }
    pFVar10[lVar4 * 5].dx_.num_elts = iVar3;
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar6 = uVar8 * 8;
    }
    pdVar5 = (double *)operator_new__(uVar6);
    pFVar10[lVar4 * 5].dx_.ptr_to_data = pdVar5;
    auVar2 = _DAT_014d28c0;
    if (local_118.dx_.num_elts != 0) goto LAB_00fb9625;
    if (0 < iVar3) {
      lVar7 = uVar8 - 1;
      auVar13._8_4_ = (int)lVar7;
      auVar13._0_8_ = lVar7;
      auVar13._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar13 = auVar13 ^ _DAT_014d28c0;
      auVar23 = _DAT_014d28b0;
      do {
        auVar35 = auVar23 ^ auVar2;
        if ((bool)(~(auVar35._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar35._0_4_ ||
                    auVar13._4_4_ < auVar35._4_4_) & 1)) {
          *(double *)((long)pdVar5 + lVar7) = local_118.defaultVal * 4.0;
        }
        if ((auVar35._12_4_ != auVar13._12_4_ || auVar35._8_4_ <= auVar13._8_4_) &&
            auVar35._12_4_ <= auVar13._12_4_) {
          *(double *)((long)pdVar5 + lVar7 + 8) = local_118.defaultVal * 4.0;
        }
        lVar33 = auVar23._8_8_;
        auVar23._0_8_ = auVar23._0_8_ + 2;
        auVar23._8_8_ = lVar33 + 2;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(iVar3 + 1U >> 1) << 4 != lVar7);
    }
  }
  iVar3 = local_158.dx_.num_elts;
  pFVar10[lVar4 * 5].val_ = local_118.val_ * 4.0;
  lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 6)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar10 = dphi->fElem;
  uVar8 = (ulong)(uint)local_158.dx_.num_elts;
  uVar1 = pFVar10[lVar4 * 5 + 1].dx_.num_elts;
  if (local_158.dx_.num_elts == uVar1) {
    if (local_158.dx_.num_elts != 0) {
      pdVar5 = pFVar10[lVar4 * 5 + 1].dx_.ptr_to_data;
LAB_00fb97f0:
      if (0 < iVar3) {
        uVar6 = 0;
        do {
          pdVar5[uVar6] = *(double *)((long)local_158.dx_.ptr_to_data + uVar6 * 8) * 4.0;
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
      }
    }
  }
  else if (local_158.dx_.num_elts == 0) {
    if (uVar1 != 0) {
      pdVar5 = pFVar10[lVar4 * 5 + 1].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar10[lVar4 * 5 + 1].dx_.num_elts = 0;
      pFVar10[lVar4 * 5 + 1].dx_.ptr_to_data = (double *)0x0;
    }
  }
  else {
    if (uVar1 != 0) {
      pdVar5 = pFVar10[lVar4 * 5 + 1].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar10[lVar4 * 5 + 1].dx_.ptr_to_data = (double *)0x0;
    }
    pFVar10[lVar4 * 5 + 1].dx_.num_elts = iVar3;
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar6 = uVar8 * 8;
    }
    pdVar5 = (double *)operator_new__(uVar6);
    pFVar10[lVar4 * 5 + 1].dx_.ptr_to_data = pdVar5;
    auVar2 = _DAT_014d28c0;
    if (local_158.dx_.num_elts != 0) goto LAB_00fb97f0;
    if (0 < iVar3) {
      lVar7 = uVar8 - 1;
      auVar14._8_4_ = (int)lVar7;
      auVar14._0_8_ = lVar7;
      auVar14._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar14 = auVar14 ^ _DAT_014d28c0;
      auVar24 = _DAT_014d28b0;
      do {
        auVar35 = auVar24 ^ auVar2;
        if ((bool)(~(auVar35._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar35._0_4_ ||
                    auVar14._4_4_ < auVar35._4_4_) & 1)) {
          *(double *)((long)pdVar5 + lVar7) = local_158.defaultVal * 4.0;
        }
        if ((auVar35._12_4_ != auVar14._12_4_ || auVar35._8_4_ <= auVar14._8_4_) &&
            auVar35._12_4_ <= auVar14._12_4_) {
          *(double *)((long)pdVar5 + lVar7 + 8) = local_158.defaultVal * 4.0;
        }
        lVar33 = auVar24._8_8_;
        auVar24._0_8_ = auVar24._0_8_ + 2;
        auVar24._8_8_ = lVar33 + 2;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(iVar3 + 1U >> 1) << 4 != lVar7);
    }
  }
  pFVar10[lVar4 * 5 + 1].val_ = local_158.val_ * 4.0;
  lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 6)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar10 = dphi->fElem;
  pFVar10[lVar4 * 5 + 2].val_ = 0.0;
  if (pFVar10[lVar4 * 5 + 2].dx_.num_elts != 0) {
    local_178._0_8_ = 0;
    Vector<double>::operator=(&pFVar10[lVar4 * 5 + 2].dx_,(double *)&local_178);
    lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  }
  iVar3 = local_118.dx_.num_elts;
  if ((lVar4 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 7)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar10 = dphi->fElem;
  uVar8 = (ulong)(uint)local_118.dx_.num_elts;
  uVar1 = pFVar10[lVar4 * 6].dx_.num_elts;
  if (local_118.dx_.num_elts == uVar1) {
    if (local_118.dx_.num_elts != 0) {
      pdVar5 = pFVar10[lVar4 * 6].dx_.ptr_to_data;
LAB_00fb9a27:
      if (0 < iVar3) {
        uVar6 = 0;
        do {
          pdVar5[uVar6] = *(double *)((long)local_118.dx_.ptr_to_data + uVar6 * 8) * -4.0;
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
      }
    }
  }
  else if (local_118.dx_.num_elts == 0) {
    if (uVar1 != 0) {
      pdVar5 = pFVar10[lVar4 * 6].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar10[lVar4 * 6].dx_.num_elts = 0;
      pFVar10[lVar4 * 6].dx_.ptr_to_data = (double *)0x0;
    }
  }
  else {
    if (uVar1 != 0) {
      pdVar5 = pFVar10[lVar4 * 6].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar10[lVar4 * 6].dx_.ptr_to_data = (double *)0x0;
    }
    pFVar10[lVar4 * 6].dx_.num_elts = iVar3;
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar6 = uVar8 * 8;
    }
    pdVar5 = (double *)operator_new__(uVar6);
    pFVar10[lVar4 * 6].dx_.ptr_to_data = pdVar5;
    auVar2 = _DAT_014d28c0;
    if (local_118.dx_.num_elts != 0) goto LAB_00fb9a27;
    if (0 < iVar3) {
      lVar7 = uVar8 - 1;
      auVar15._8_4_ = (int)lVar7;
      auVar15._0_8_ = lVar7;
      auVar15._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar15 = auVar15 ^ _DAT_014d28c0;
      auVar25 = _DAT_014d28b0;
      do {
        auVar35 = auVar25 ^ auVar2;
        if ((bool)(~(auVar35._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar35._0_4_ ||
                    auVar15._4_4_ < auVar35._4_4_) & 1)) {
          *(double *)((long)pdVar5 + lVar7) = local_118.defaultVal * -4.0;
        }
        if ((auVar35._12_4_ != auVar15._12_4_ || auVar35._8_4_ <= auVar15._8_4_) &&
            auVar35._12_4_ <= auVar15._12_4_) {
          *(double *)((long)pdVar5 + lVar7 + 8) = local_118.defaultVal * -4.0;
        }
        lVar33 = auVar25._8_8_;
        auVar25._0_8_ = auVar25._0_8_ + 2;
        auVar25._8_8_ = lVar33 + 2;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(iVar3 + 1U >> 1) << 4 != lVar7);
    }
  }
  pFVar10[lVar4 * 6].val_ = local_118.val_ * -4.0;
  local_f8.fadexpr_.left_ =
       (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
        *)&local_158;
  local_138.fadexpr_.right_ = &local_118;
  local_c8._0_8_ = &local_f8;
  local_c8._8_8_ = &local_e8;
  local_b0._0_8_ = local_c8;
  local_b0.fadexpr_.left_.constant_ = 1.0;
  local_b0.fadexpr_.left_.defaultVal = 0.0;
  local_178.fadexpr_.left_.constant_ = -4.0;
  local_178.fadexpr_.left_.defaultVal = 0.0;
  local_138.fadexpr_.left_.constant_ = 4.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  local_f8.fadexpr_.right_ =
       (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_138.fadexpr_.right_;
  local_88 = (Fad<double> *)&local_138;
  if ((lVar4 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 7)) {
    local_178.fadexpr_.right_ = pFVar9;
    local_90 = &local_178;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_178.fadexpr_.right_ = pFVar9;
  local_90 = &local_178;
  Fad<double>::operator=
            (dphi->fElem + lVar4 * 6 + 1,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)&local_90);
  iVar3 = local_118.dx_.num_elts;
  lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 7)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar10 = dphi->fElem;
  uVar8 = (ulong)(uint)local_118.dx_.num_elts;
  uVar1 = pFVar10[lVar4 * 6 + 2].dx_.num_elts;
  if (local_118.dx_.num_elts == uVar1) {
    if (local_118.dx_.num_elts != 0) {
      pdVar5 = pFVar10[lVar4 * 6 + 2].dx_.ptr_to_data;
LAB_00fb9cde:
      if (0 < iVar3) {
        uVar6 = 0;
        do {
          pdVar5[uVar6] = *(double *)((long)local_118.dx_.ptr_to_data + uVar6 * 8) * -4.0;
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
      }
    }
  }
  else if (local_118.dx_.num_elts == 0) {
    if (uVar1 != 0) {
      pdVar5 = pFVar10[lVar4 * 6 + 2].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar10[lVar4 * 6 + 2].dx_.num_elts = 0;
      pFVar10[lVar4 * 6 + 2].dx_.ptr_to_data = (double *)0x0;
    }
  }
  else {
    if (uVar1 != 0) {
      pdVar5 = pFVar10[lVar4 * 6 + 2].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar10[lVar4 * 6 + 2].dx_.ptr_to_data = (double *)0x0;
    }
    pFVar10[lVar4 * 6 + 2].dx_.num_elts = iVar3;
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar6 = uVar8 * 8;
    }
    pdVar5 = (double *)operator_new__(uVar6);
    pFVar10[lVar4 * 6 + 2].dx_.ptr_to_data = pdVar5;
    auVar2 = _DAT_014d28c0;
    if (local_118.dx_.num_elts != 0) goto LAB_00fb9cde;
    if (0 < iVar3) {
      lVar7 = uVar8 - 1;
      auVar16._8_4_ = (int)lVar7;
      auVar16._0_8_ = lVar7;
      auVar16._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar16 = auVar16 ^ _DAT_014d28c0;
      auVar26 = _DAT_014d28b0;
      do {
        auVar35 = auVar26 ^ auVar2;
        if ((bool)(~(auVar35._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar35._0_4_ ||
                    auVar16._4_4_ < auVar35._4_4_) & 1)) {
          *(double *)((long)pdVar5 + lVar7) = local_118.defaultVal * -4.0;
        }
        if ((auVar35._12_4_ != auVar16._12_4_ || auVar35._8_4_ <= auVar16._8_4_) &&
            auVar35._12_4_ <= auVar16._12_4_) {
          *(double *)((long)pdVar5 + lVar7 + 8) = local_118.defaultVal * -4.0;
        }
        lVar33 = auVar26._8_8_;
        auVar26._0_8_ = auVar26._0_8_ + 2;
        auVar26._8_8_ = lVar33 + 2;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(iVar3 + 1U >> 1) << 4 != lVar7);
    }
  }
  iVar3 = local_e8.dx_.num_elts;
  pFVar10[lVar4 * 6 + 2].val_ = local_118.val_ * -4.0;
  lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar10 = dphi->fElem;
  uVar8 = (ulong)(uint)local_e8.dx_.num_elts;
  uVar1 = pFVar10[lVar4 * 7].dx_.num_elts;
  if (local_e8.dx_.num_elts == uVar1) {
    if (local_e8.dx_.num_elts != 0) {
      pdVar5 = pFVar10[lVar4 * 7].dx_.ptr_to_data;
LAB_00fb9eae:
      if (0 < iVar3) {
        uVar6 = 0;
        do {
          pdVar5[uVar6] = *(double *)((long)local_e8.dx_.ptr_to_data + uVar6 * 8) * -4.0;
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
      }
    }
  }
  else if (local_e8.dx_.num_elts == 0) {
    if (uVar1 != 0) {
      pdVar5 = pFVar10[lVar4 * 7].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar10[lVar4 * 7].dx_.num_elts = 0;
      pFVar10[lVar4 * 7].dx_.ptr_to_data = (double *)0x0;
    }
  }
  else {
    if (uVar1 != 0) {
      pdVar5 = pFVar10[lVar4 * 7].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar10[lVar4 * 7].dx_.ptr_to_data = (double *)0x0;
    }
    pFVar10[lVar4 * 7].dx_.num_elts = iVar3;
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar6 = uVar8 * 8;
    }
    pdVar5 = (double *)operator_new__(uVar6);
    pFVar10[lVar4 * 7].dx_.ptr_to_data = pdVar5;
    auVar2 = _DAT_014d28c0;
    if (local_e8.dx_.num_elts != 0) goto LAB_00fb9eae;
    if (0 < iVar3) {
      lVar7 = uVar8 - 1;
      auVar17._8_4_ = (int)lVar7;
      auVar17._0_8_ = lVar7;
      auVar17._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar17 = auVar17 ^ _DAT_014d28c0;
      auVar27 = _DAT_014d28b0;
      do {
        auVar35 = auVar27 ^ auVar2;
        if ((bool)(~(auVar35._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar35._0_4_ ||
                    auVar17._4_4_ < auVar35._4_4_) & 1)) {
          *(double *)((long)pdVar5 + lVar7) = local_e8.defaultVal * -4.0;
        }
        if ((auVar35._12_4_ != auVar17._12_4_ || auVar35._8_4_ <= auVar17._8_4_) &&
            auVar35._12_4_ <= auVar17._12_4_) {
          *(double *)((long)pdVar5 + lVar7 + 8) = local_e8.defaultVal * -4.0;
        }
        lVar33 = auVar27._8_8_;
        auVar27._0_8_ = auVar27._0_8_ + 2;
        auVar27._8_8_ = lVar33 + 2;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(iVar3 + 1U >> 1) << 4 != lVar7);
    }
  }
  iVar3 = local_e8.dx_.num_elts;
  pFVar10[lVar4 * 7].val_ = local_e8.val_ * -4.0;
  lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar10 = dphi->fElem;
  uVar8 = (ulong)(uint)local_e8.dx_.num_elts;
  uVar1 = pFVar10[lVar4 * 7 + 1].dx_.num_elts;
  if (local_e8.dx_.num_elts == uVar1) {
    if (local_e8.dx_.num_elts != 0) {
      pdVar5 = pFVar10[lVar4 * 7 + 1].dx_.ptr_to_data;
LAB_00fba087:
      if (0 < iVar3) {
        uVar6 = 0;
        do {
          pdVar5[uVar6] = *(double *)((long)local_e8.dx_.ptr_to_data + uVar6 * 8) * -4.0;
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
      }
    }
  }
  else if (local_e8.dx_.num_elts == 0) {
    if (uVar1 != 0) {
      pdVar5 = pFVar10[lVar4 * 7 + 1].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar10[lVar4 * 7 + 1].dx_.num_elts = 0;
      pFVar10[lVar4 * 7 + 1].dx_.ptr_to_data = (double *)0x0;
    }
  }
  else {
    if (uVar1 != 0) {
      pdVar5 = pFVar10[lVar4 * 7 + 1].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar10[lVar4 * 7 + 1].dx_.ptr_to_data = (double *)0x0;
    }
    pFVar10[lVar4 * 7 + 1].dx_.num_elts = iVar3;
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar6 = uVar8 * 8;
    }
    pdVar5 = (double *)operator_new__(uVar6);
    pFVar10[lVar4 * 7 + 1].dx_.ptr_to_data = pdVar5;
    auVar2 = _DAT_014d28c0;
    if (local_e8.dx_.num_elts != 0) goto LAB_00fba087;
    if (0 < iVar3) {
      lVar7 = uVar8 - 1;
      auVar18._8_4_ = (int)lVar7;
      auVar18._0_8_ = lVar7;
      auVar18._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar18 = auVar18 ^ _DAT_014d28c0;
      auVar28 = _DAT_014d28b0;
      do {
        auVar35 = auVar28 ^ auVar2;
        if ((bool)(~(auVar35._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar35._0_4_ ||
                    auVar18._4_4_ < auVar35._4_4_) & 1)) {
          *(double *)((long)pdVar5 + lVar7) = local_e8.defaultVal * -4.0;
        }
        if ((auVar35._12_4_ != auVar18._12_4_ || auVar35._8_4_ <= auVar18._8_4_) &&
            auVar35._12_4_ <= auVar18._12_4_) {
          *(double *)((long)pdVar5 + lVar7 + 8) = local_e8.defaultVal * -4.0;
        }
        lVar33 = auVar28._8_8_;
        auVar28._0_8_ = auVar28._0_8_ + 2;
        auVar28._8_8_ = lVar33 + 2;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(iVar3 + 1U >> 1) << 4 != lVar7);
    }
  }
  pFVar10[lVar4 * 7 + 1].val_ = local_e8.val_ * -4.0;
  local_f8.fadexpr_.left_ =
       (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
        *)&local_158;
  local_f8.fadexpr_.right_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&local_118;
  local_c8._0_8_ = &local_f8;
  local_138.fadexpr_.right_ = &local_e8;
  local_b0._0_8_ = local_c8;
  local_b0.fadexpr_.left_.constant_ = 1.0;
  local_b0.fadexpr_.left_.defaultVal = 0.0;
  local_178.fadexpr_.left_.constant_ = -4.0;
  local_178.fadexpr_.left_.defaultVal = 0.0;
  local_138.fadexpr_.left_.constant_ = 4.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  local_c8._8_8_ = local_138.fadexpr_.right_;
  if ((lVar4 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
    local_178.fadexpr_.right_ = pFVar9;
    local_90 = &local_178;
    local_88 = (Fad<double> *)&local_138;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_178.fadexpr_.right_ = pFVar9;
  local_90 = &local_178;
  local_88 = (Fad<double> *)&local_138;
  Fad<double>::operator=
            (dphi->fElem + lVar4 * 7 + 2,
             (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)&local_90);
  iVar3 = local_e8.dx_.num_elts;
  lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar9 = dphi->fElem;
  uVar8 = (ulong)(uint)local_e8.dx_.num_elts;
  uVar1 = pFVar9[lVar4 * 8].dx_.num_elts;
  if (local_e8.dx_.num_elts == uVar1) {
    if (local_e8.dx_.num_elts != 0) {
      pdVar5 = pFVar9[lVar4 * 8].dx_.ptr_to_data;
LAB_00fba351:
      if (0 < iVar3) {
        uVar6 = 0;
        do {
          pdVar5[uVar6] = *(double *)((long)local_e8.dx_.ptr_to_data + uVar6 * 8) * 4.0;
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
      }
    }
  }
  else if (local_e8.dx_.num_elts == 0) {
    if (uVar1 != 0) {
      pdVar5 = pFVar9[lVar4 * 8].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar9[lVar4 * 8].dx_.num_elts = 0;
      pFVar9[lVar4 * 8].dx_.ptr_to_data = (double *)0x0;
    }
  }
  else {
    if (uVar1 != 0) {
      pdVar5 = pFVar9[lVar4 * 8].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar9[lVar4 * 8].dx_.ptr_to_data = (double *)0x0;
    }
    pFVar9[lVar4 * 8].dx_.num_elts = iVar3;
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar6 = uVar8 * 8;
    }
    pdVar5 = (double *)operator_new__(uVar6);
    pFVar9[lVar4 * 8].dx_.ptr_to_data = pdVar5;
    auVar2 = _DAT_014d28c0;
    if (local_e8.dx_.num_elts != 0) goto LAB_00fba351;
    if (0 < iVar3) {
      lVar7 = uVar8 - 1;
      auVar19._8_4_ = (int)lVar7;
      auVar19._0_8_ = lVar7;
      auVar19._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar19 = auVar19 ^ _DAT_014d28c0;
      auVar29 = _DAT_014d28b0;
      do {
        auVar35 = auVar29 ^ auVar2;
        if ((bool)(~(auVar35._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar35._0_4_ ||
                    auVar19._4_4_ < auVar35._4_4_) & 1)) {
          *(double *)((long)pdVar5 + lVar7) = local_e8.defaultVal * 4.0;
        }
        if ((auVar35._12_4_ != auVar19._12_4_ || auVar35._8_4_ <= auVar19._8_4_) &&
            auVar35._12_4_ <= auVar19._12_4_) {
          *(double *)((long)pdVar5 + lVar7 + 8) = local_e8.defaultVal * 4.0;
        }
        lVar33 = auVar29._8_8_;
        auVar29._0_8_ = auVar29._0_8_ + 2;
        auVar29._8_8_ = lVar33 + 2;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(iVar3 + 1U >> 1) << 4 != lVar7);
    }
  }
  pFVar9[lVar4 * 8].val_ = local_e8.val_ * 4.0;
  lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar9 = dphi->fElem;
  pFVar9[lVar4 * 8 + 1].val_ = 0.0;
  if (pFVar9[lVar4 * 8 + 1].dx_.num_elts != 0) {
    local_178._0_8_ = 0;
    Vector<double>::operator=(&pFVar9[lVar4 * 8 + 1].dx_,(double *)&local_178);
    lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  }
  iVar3 = local_158.dx_.num_elts;
  if ((lVar4 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar9 = dphi->fElem;
  uVar8 = (ulong)(uint)local_158.dx_.num_elts;
  uVar1 = pFVar9[lVar4 * 8 + 2].dx_.num_elts;
  if (local_158.dx_.num_elts == uVar1) {
    if (local_158.dx_.num_elts != 0) {
      pdVar5 = pFVar9[lVar4 * 8 + 2].dx_.ptr_to_data;
LAB_00fba596:
      if (0 < iVar3) {
        uVar6 = 0;
        do {
          pdVar5[uVar6] = *(double *)((long)local_158.dx_.ptr_to_data + uVar6 * 8) * 4.0;
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
      }
    }
  }
  else if (local_158.dx_.num_elts == 0) {
    if (uVar1 != 0) {
      pdVar5 = pFVar9[lVar4 * 8 + 2].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar9[lVar4 * 8 + 2].dx_.num_elts = 0;
      pFVar9[lVar4 * 8 + 2].dx_.ptr_to_data = (double *)0x0;
    }
  }
  else {
    if (uVar1 != 0) {
      pdVar5 = pFVar9[lVar4 * 8 + 2].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar9[lVar4 * 8 + 2].dx_.ptr_to_data = (double *)0x0;
    }
    pFVar9[lVar4 * 8 + 2].dx_.num_elts = iVar3;
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar6 = uVar8 * 8;
    }
    pdVar5 = (double *)operator_new__(uVar6);
    pFVar9[lVar4 * 8 + 2].dx_.ptr_to_data = pdVar5;
    auVar2 = _DAT_014d28c0;
    if (local_158.dx_.num_elts != 0) goto LAB_00fba596;
    if (0 < iVar3) {
      lVar7 = uVar8 - 1;
      auVar20._8_4_ = (int)lVar7;
      auVar20._0_8_ = lVar7;
      auVar20._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar20 = auVar20 ^ _DAT_014d28c0;
      auVar30 = _DAT_014d28b0;
      do {
        auVar35 = auVar30 ^ auVar2;
        if ((bool)(~(auVar35._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar35._0_4_ ||
                    auVar20._4_4_ < auVar35._4_4_) & 1)) {
          *(double *)((long)pdVar5 + lVar7) = local_158.defaultVal * 4.0;
        }
        if ((auVar35._12_4_ != auVar20._12_4_ || auVar35._8_4_ <= auVar20._8_4_) &&
            auVar35._12_4_ <= auVar20._12_4_) {
          *(double *)((long)pdVar5 + lVar7 + 8) = local_158.defaultVal * 4.0;
        }
        lVar33 = auVar30._8_8_;
        auVar30._0_8_ = auVar30._0_8_ + 2;
        auVar30._8_8_ = lVar33 + 2;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(iVar3 + 1U >> 1) << 4 != lVar7);
    }
  }
  pFVar9[lVar4 * 8 + 2].val_ = local_158.val_ * 4.0;
  lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar9 = dphi->fElem;
  pFVar9[lVar4 * 9].val_ = 0.0;
  if (pFVar9[lVar4 * 9].dx_.num_elts != 0) {
    local_178._0_8_ = 0;
    Vector<double>::operator=(&pFVar9[lVar4 * 9].dx_,(double *)&local_178);
    lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  }
  iVar3 = local_e8.dx_.num_elts;
  if ((lVar4 < 2) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar9 = dphi->fElem;
  uVar8 = (ulong)(uint)local_e8.dx_.num_elts;
  uVar1 = pFVar9[lVar4 * 9 + 1].dx_.num_elts;
  if (local_e8.dx_.num_elts == uVar1) {
    if (local_e8.dx_.num_elts != 0) {
      pdVar5 = pFVar9[lVar4 * 9 + 1].dx_.ptr_to_data;
LAB_00fba7e0:
      if (0 < iVar3) {
        uVar6 = 0;
        do {
          pdVar5[uVar6] = *(double *)((long)local_e8.dx_.ptr_to_data + uVar6 * 8) * 4.0;
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
      }
    }
  }
  else if (local_e8.dx_.num_elts == 0) {
    if (uVar1 != 0) {
      pdVar5 = pFVar9[lVar4 * 9 + 1].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar9[lVar4 * 9 + 1].dx_.num_elts = 0;
      pFVar9[lVar4 * 9 + 1].dx_.ptr_to_data = (double *)0x0;
    }
  }
  else {
    if (uVar1 != 0) {
      pdVar5 = pFVar9[lVar4 * 9 + 1].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar9[lVar4 * 9 + 1].dx_.ptr_to_data = (double *)0x0;
    }
    pFVar9[lVar4 * 9 + 1].dx_.num_elts = iVar3;
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar6 = uVar8 * 8;
    }
    pdVar5 = (double *)operator_new__(uVar6);
    pFVar9[lVar4 * 9 + 1].dx_.ptr_to_data = pdVar5;
    auVar2 = _DAT_014d28c0;
    if (local_e8.dx_.num_elts != 0) goto LAB_00fba7e0;
    if (0 < iVar3) {
      lVar7 = uVar8 - 1;
      auVar21._8_4_ = (int)lVar7;
      auVar21._0_8_ = lVar7;
      auVar21._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar21 = auVar21 ^ _DAT_014d28c0;
      auVar31 = _DAT_014d28b0;
      do {
        auVar35 = auVar31 ^ auVar2;
        if ((bool)(~(auVar35._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar35._0_4_ ||
                    auVar21._4_4_ < auVar35._4_4_) & 1)) {
          *(double *)((long)pdVar5 + lVar7) = local_e8.defaultVal * 4.0;
        }
        if ((auVar35._12_4_ != auVar21._12_4_ || auVar35._8_4_ <= auVar21._8_4_) &&
            auVar35._12_4_ <= auVar21._12_4_) {
          *(double *)((long)pdVar5 + lVar7 + 8) = local_e8.defaultVal * 4.0;
        }
        lVar33 = auVar31._8_8_;
        auVar31._0_8_ = auVar31._0_8_ + 2;
        auVar31._8_8_ = lVar33 + 2;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(iVar3 + 1U >> 1) << 4 != lVar7);
    }
  }
  iVar3 = local_118.dx_.num_elts;
  pFVar9[lVar4 * 9 + 1].val_ = local_e8.val_ * 4.0;
  lVar4 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar4 < 3) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar9 = dphi->fElem;
  uVar8 = (ulong)(uint)local_118.dx_.num_elts;
  uVar1 = pFVar9[lVar4 * 9 + 2].dx_.num_elts;
  if (local_118.dx_.num_elts == uVar1) {
    if (local_118.dx_.num_elts == 0) goto LAB_00fbaac5;
    pdVar5 = pFVar9[lVar4 * 9 + 2].dx_.ptr_to_data;
  }
  else {
    if (local_118.dx_.num_elts == 0) {
      if (uVar1 != 0) {
        pdVar5 = pFVar9[lVar4 * 9 + 2].dx_.ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        pFVar9[lVar4 * 9 + 2].dx_.num_elts = 0;
        pFVar9[lVar4 * 9 + 2].dx_.ptr_to_data = (double *)0x0;
      }
      goto LAB_00fbaac5;
    }
    if (uVar1 != 0) {
      pdVar5 = pFVar9[lVar4 * 9 + 2].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar9[lVar4 * 9 + 2].dx_.ptr_to_data = (double *)0x0;
    }
    pFVar9[lVar4 * 9 + 2].dx_.num_elts = iVar3;
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar3) {
      uVar6 = uVar8 * 8;
    }
    pdVar5 = (double *)operator_new__(uVar6);
    pFVar9[lVar4 * 9 + 2].dx_.ptr_to_data = pdVar5;
    auVar2 = _DAT_014d28c0;
    if (local_118.dx_.num_elts == 0) {
      if (0 < iVar3) {
        lVar7 = uVar8 - 1;
        auVar22._8_4_ = (int)lVar7;
        auVar22._0_8_ = lVar7;
        auVar22._12_4_ = (int)((ulong)lVar7 >> 0x20);
        lVar7 = 0;
        auVar22 = auVar22 ^ _DAT_014d28c0;
        auVar32 = _DAT_014d28b0;
        do {
          auVar35 = auVar32 ^ auVar2;
          if ((bool)(~(auVar35._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar35._0_4_ ||
                      auVar22._4_4_ < auVar35._4_4_) & 1)) {
            *(double *)((long)pdVar5 + lVar7) = local_118.defaultVal * 4.0;
          }
          if ((auVar35._12_4_ != auVar22._12_4_ || auVar35._8_4_ <= auVar22._8_4_) &&
              auVar35._12_4_ <= auVar22._12_4_) {
            *(double *)((long)pdVar5 + lVar7 + 8) = local_118.defaultVal * 4.0;
          }
          lVar33 = auVar32._8_8_;
          auVar32._0_8_ = auVar32._0_8_ + 2;
          auVar32._8_8_ = lVar33 + 2;
          lVar7 = lVar7 + 0x10;
        } while ((ulong)(iVar3 + 1U >> 1) << 4 != lVar7);
      }
      goto LAB_00fbaac5;
    }
  }
  if (0 < iVar3) {
    uVar6 = 0;
    do {
      pdVar5[uVar6] = *(double *)((long)local_118.dx_.ptr_to_data + uVar6 * 8) * 4.0;
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
LAB_00fbaac5:
  pFVar9[lVar4 * 9 + 2].val_ = local_118.val_ * 4.0;
  Fad<double>::~Fad(&local_e8);
  Fad<double>::~Fad(&local_118);
  Fad<double>::~Fad(&local_158);
  return;
}

Assistant:

void TPZQuadraticTetra::TShape(const TPZVec<T> &par, TPZFMatrix<T> &phi, TPZFMatrix<T> &dphi)
{
	T qsi = par[0], eta = par[1], zeta = par[2];
	
    phi(0,0)  =  (zeta + eta + qsi -1.) * (2.*zeta + 2.*eta + 2.*qsi - 1.);
//    phi(0,0)  =  (qsi + eta + zeta -1.) * (2.*qsi + 2.*eta + 2.*zeta - 1.);
//    phi(0,0)  =  2.*qsi*qsi + 2.*eta*eta + 2.*zeta*zeta + 4.*qsi*eta + 4.*qsi*zeta + 4.*eta*zeta - 3.*qsi - 3.*eta - 3.*zeta + 1.;
	phi(1,0)  =  qsi  * (2.*qsi - 1.);
	phi(2,0)  =  eta  * (2.*eta - 1.);
	phi(3,0)  =  zeta * (2.*zeta - 1.);
	phi(4,0)  = -4.*qsi  * (qsi + eta + zeta -1.);
	phi(5,0)  =  4.*qsi  *  eta;
	phi(6,0)  = -4.*eta  * (qsi + eta + zeta -1.);
	phi(7,0)  = -4.*zeta * (qsi + eta + zeta -1.);
	phi(8,0)  =  4.*qsi  *  zeta;
	phi(9,0)  =  4.*eta  *  zeta;
	
	dphi(0,0) =  -3. + 4.*qsi + 4.*eta + 4.*zeta;
	dphi(1,0) =  -3. + 4.*qsi + 4.*eta + 4.*zeta;
	dphi(2,0) =  -3. + 4.*qsi + 4.*eta + 4.*zeta;
	dphi(0,1) =  -1. + 4.*qsi;
	dphi(1,1) =   0.;
	dphi(2,1) =   0.;
	dphi(0,2) =   0.;
	dphi(1,2) =  -1. + 4.*eta;
	dphi(2,2) =   0.;
	dphi(0,3) =   0.;
	dphi(1,3) =   0.;
	dphi(2,3) =  -1. + 4.*zeta;
	dphi(0,4) =  -4.*(2.*qsi + eta + zeta - 1.);
	dphi(1,4) =  -4.*qsi;
	dphi(2,4) =  -4.*qsi;
	dphi(0,5) =   4.*eta;
	dphi(1,5) =   4.*qsi;
	dphi(2,5) =   0.;
	dphi(0,6) =  -4.*eta;
	dphi(1,6) =  -4.*(qsi + eta + zeta - 1.)-4.*eta;
	dphi(2,6) =  -4.*eta;
	dphi(0,7) =  -4.*zeta;
	dphi(1,7) =  -4.*zeta;
	dphi(2,7) =  -4.*(qsi + eta + zeta - 1.)-4.*zeta;
	dphi(0,8) =   4.*zeta;
	dphi(1,8) =   0.;
	dphi(2,8) =   4.*qsi;
	dphi(0,9) =   0.;
	dphi(1,9) =   4.*zeta;
	dphi(2,9) =   4.*eta;
}